

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkInfo.cpp
# Opt level: O0

void __thiscall
LinkInfo::fillLinkInfo
          (LinkInfo *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *linkInfo)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  uint uVar1;
  uint uVar2;
  reference pvVar3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __result;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x_00;
  VolumeIDStruct *__x_01;
  CommonNetworkRelativeLinkStruct *__x_02;
  bool bVar4;
  const_iterator local_648;
  int local_63c;
  undefined1 local_638 [4];
  int countBytesBeforeNullTerminated_2;
  uchar *local_620;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_618;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_610;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_608;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_600;
  const_iterator local_5f8;
  int local_5f0;
  byte local_5e9;
  int countBytesBeforeNullTerminated_1;
  uchar *local_5d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_5c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_5c0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_5b8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_5b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_590;
  int local_574;
  iterator iStack_570;
  int len;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_568;
  uint *local_560;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_558;
  uchar *local_550;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_548;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_540;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_538;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_530;
  uchar *local_528;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_520;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_518;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_510;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_508;
  uchar *local_500;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_4f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_4f0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_4e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_4e0;
  uchar *local_4d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_4d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_4c8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_4c0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_4b8;
  uchar *local_4b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_4a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_4a0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_498;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_490;
  uchar *local_488;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_480;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_478;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_470;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_468;
  uchar *local_460;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_458;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_450;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_448;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_440;
  uchar *local_438;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_430;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_428;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_420;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_418;
  uint *local_410;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_408;
  uchar *local_400;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_3f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_3f0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_3e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_3e0;
  uchar *local_3d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_3d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_3c8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_3c0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_3b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3b0;
  uint local_394;
  iterator iStack_390;
  int count_1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_388;
  uchar *local_380;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_378;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_370;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_368;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_360;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_358;
  uchar *local_350;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_348;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_340;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_338;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_330;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_328;
  const_iterator local_320;
  int local_314;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_310;
  int countBytesBeforeNullTerminated;
  uchar *local_308;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_300;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_2f8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2f0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2e0;
  uchar *local_2d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_2d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_2c8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2c0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2b8;
  uint *local_2b0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_2a8;
  uchar *local_2a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_298;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_290;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_288;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_280;
  uchar *local_278;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_270;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_268;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_260;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_258;
  uchar *local_250;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_248;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_240;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_238;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_230;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  uint local_20c;
  iterator iStack_208;
  int count;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_200;
  uchar *local_1f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1e8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1e0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d8;
  uchar *local_1d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1c0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b0;
  uchar *local_1a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_198;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_190;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_188;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_170;
  uchar *local_158;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_150;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_148;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_140;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_138;
  uchar *local_130;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_128;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_120;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_118;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_110;
  uchar *local_108;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_100;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_f8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e8;
  uchar *local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_d0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c0;
  uint *local_b8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b0;
  uchar *local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_98;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_88;
  uint *local_80;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_78;
  uchar *local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  uchar *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_20;
  iterator it;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *linkInfo_local;
  LinkInfo *this_local;
  
  it._M_current = (uchar *)linkInfo;
  local_28._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(linkInfo);
  local_20._M_current = local_28._M_current;
  local_30 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_20,4);
  local_38 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                       (&this->LinkInfoSize);
  local_40 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::
             copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                       (local_28,local_30,
                        (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         )local_38);
  local_50 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_20,4);
  local_48 = local_50._M_current;
  local_20 = local_50;
  local_58 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_20,4);
  __x = &this->LinkInfoHeaderSize;
  local_60 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>(__x);
  local_68 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::
             copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                       (local_50,local_58,
                        (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         )local_60);
  local_70 = (uchar *)__gnu_cxx::
                      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_20,4);
  local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_70;
  local_78._M_current = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(__x)
  ;
  local_80 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(__x);
  std::
  reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (local_78,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       )local_80);
  local_88._M_current = local_20._M_current;
  local_90 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_20,4);
  __x_00 = &this->LinkInfoFlags;
  local_98 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>(__x_00);
  local_a0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::
             copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                       (local_88,local_90,
                        (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         )local_98);
  local_a8 = (uchar *)__gnu_cxx::
                      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator+(&local_20,4);
  local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_a8;
  local_b0._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(__x_00);
  local_b8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(__x_00);
  std::
  reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (local_b0,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       )local_b8);
  local_c0._M_current = local_20._M_current;
  local_c8 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_20,4);
  local_d0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                       (&this->VolumeIDOffset);
  local_d8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::
             copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                       (local_c0,local_c8,
                        (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         )local_d0);
  local_e8 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_20,4);
  local_e0 = local_e8._M_current;
  local_20 = local_e8;
  local_f0 = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_20,4);
  local_f8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                       (&this->LocalBasePathOffset);
  local_100 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              std::
              copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                        (local_e8,local_f0,
                         (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )local_f8);
  local_110 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_20,4);
  local_108 = local_110._M_current;
  local_20 = local_110;
  local_118 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_20,4);
  local_120 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        (&this->CommonNetworkRelativeLinkOffset);
  local_128 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              std::
              copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                        (local_110,local_118,
                         (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )local_120);
  local_138 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_20,4);
  local_130 = local_138._M_current;
  local_20 = local_138;
  local_140 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_20,4);
  local_148 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        (&this->CommonPathSuffixOffset);
  local_150 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              std::
              copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                        (local_138,local_140,
                         (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )local_148);
  local_158 = (uchar *)__gnu_cxx::
                       __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ::operator+(&local_20,4);
  local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_158;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_170,__x);
  uVar1 = Utils::lenFourBytes(&local_170);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_170);
  if (0x23 < uVar1) {
    local_188._M_current = local_20._M_current;
    local_190 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_198 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&this->LocalBasePathOffsetUnicode);
    local_1a0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (local_188,local_190,
                           (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )local_198);
    local_1b0 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_1a8 = local_1b0._M_current;
    local_20 = local_1b0;
    local_1b8 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_1c0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&this->CommonPathSuffixOffsetUnicode);
    local_1c8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (local_1b0,local_1b8,
                           (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )local_1c0);
    local_1d0 = (uchar *)__gnu_cxx::
                         __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator+(&local_20,4);
    local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_1d0;
  }
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->LinkInfoFlags,3);
  if (*pvVar3 == 1) {
    local_1d8._M_current = local_20._M_current;
    local_1e0 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    __x_01 = &this->VolumeID;
    local_1e8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&__x_01->VolumeIDSize);
    local_1f0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (local_1d8,local_1e0,
                           (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )local_1e8);
    local_1f8 = (uchar *)__gnu_cxx::
                         __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator+(&local_20,4);
    local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_1f8;
    local_200._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (&__x_01->VolumeIDSize);
    iStack_208 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           (&__x_01->VolumeIDSize);
    std::
    reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (local_200,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )iStack_208._M_current);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_228,&__x_01->VolumeIDSize);
    uVar1 = Utils::lenFourBytes(&local_228);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_228);
    local_230._M_current = local_20._M_current;
    local_20c = uVar1;
    local_238 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_240 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&(this->VolumeID).DriveType);
    local_248 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (local_230,local_238,
                           (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )local_240);
    local_258 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_250 = local_258._M_current;
    local_20 = local_258;
    local_260 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_268 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&(this->VolumeID).DriveSerialNumber);
    local_270 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (local_258,local_260,
                           (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )local_268);
    local_280 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_278 = local_280._M_current;
    local_20 = local_280;
    local_288 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_290 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&(this->VolumeID).VolumeLabelOffset);
    local_298 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (local_280,local_288,
                           (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )local_290);
    local_2a0 = (uchar *)__gnu_cxx::
                         __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator+(&local_20,4);
    local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_2a0;
    local_2a8._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (&(this->VolumeID).VolumeLabelOffset);
    local_2b0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                  (&(this->VolumeID).VolumeLabelOffset);
    std::
    reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (local_2a8,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )local_2b0);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&(this->VolumeID).VolumeLabelOffset,3);
    if (*pvVar3 != 0x10) {
      local_2b8._M_current = local_20._M_current;
      local_2c0 = __gnu_cxx::
                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_20,4);
      local_2c8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                            (&(this->VolumeID).VolumeLabelOffsetUnicode);
      local_2d0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  std::
                  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                            (local_2b8,local_2c0,
                             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              )local_2c8);
      local_2d8 = (uchar *)__gnu_cxx::
                           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           ::operator+(&local_20,4);
      local_20c = local_20c - 4;
      local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )local_2d8;
    }
    local_2e0._M_current = local_20._M_current;
    local_2f0 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,(long)(int)local_20c);
    local_2e8 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator-(&local_2f0,0x10);
    local_2f8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&(this->VolumeID).Data);
    local_300 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (local_2e0,local_2e8,
                           (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )local_2f8);
    _Stack_310 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator+(&local_20,(long)(int)local_20c);
    local_308 = (uchar *)__gnu_cxx::
                         __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator-(&stack0xfffffffffffffcf0,0x10);
    local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_308;
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_320,&local_20);
    local_314 = Utils::getCountOfBytesBeforeNullTerminator(local_320);
    local_328._M_current = local_20._M_current;
    local_338 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,(long)local_314);
    local_330 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator-(&local_338,1);
    local_340 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&this->LocalBasePath);
    local_348 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (local_328,local_330,
                           (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )local_340);
    local_358 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,(long)local_314);
    local_350 = (uchar *)__gnu_cxx::
                         __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator-(&local_358,1);
    local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_350;
  }
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->LinkInfoFlags,3);
  if (*pvVar3 == 2) {
    local_360._M_current = local_20._M_current;
    local_368 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    __x_02 = &this->CommonNetworkRelativeLink;
    local_370 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&__x_02->CommonNetworkRelativeLinkSize);
    local_378 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (local_360,local_368,
                           (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )local_370);
    local_380 = (uchar *)__gnu_cxx::
                         __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator+(&local_20,4);
    local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_380;
    local_388._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (&__x_02->CommonNetworkRelativeLinkSize);
    iStack_390 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           (&__x_02->CommonNetworkRelativeLinkSize);
    std::
    reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (local_388,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )iStack_390._M_current);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_3b0,&__x_02->CommonNetworkRelativeLinkSize);
    uVar1 = Utils::lenFourBytes(&local_3b0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_3b0);
    local_3b8._M_current = local_20._M_current;
    local_394 = uVar1;
    local_3c0 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_3c8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&(this->CommonNetworkRelativeLink).CommonNetworkRelativeLinkFlags);
    local_3d0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (local_3b8,local_3c0,
                           (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )local_3c8);
    local_3e0 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_3d8 = local_3e0._M_current;
    local_20 = local_3e0;
    local_3e8 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_3f0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&(this->CommonNetworkRelativeLink).NetNameOffset);
    local_3f8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (local_3e0,local_3e8,
                           (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )local_3f0);
    local_400 = (uchar *)__gnu_cxx::
                         __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator+(&local_20,4);
    local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_400;
    local_408._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (&(this->CommonNetworkRelativeLink).NetNameOffset);
    local_410 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                  (&(this->CommonNetworkRelativeLink).NetNameOffset);
    std::
    reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (local_408,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )local_410);
    local_418._M_current = local_20._M_current;
    local_420 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_428 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&(this->CommonNetworkRelativeLink).DeviceNameOffset);
    local_430 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (local_418,local_420,
                           (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )local_428);
    local_440 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_438 = local_440._M_current;
    local_20 = local_440;
    local_448 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_450 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&(this->CommonNetworkRelativeLink).NetworkProviderType);
    local_458 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (local_440,local_448,
                           (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )local_450);
    local_460 = (uchar *)__gnu_cxx::
                         __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator+(&local_20,4);
    local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_460;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&(this->CommonNetworkRelativeLink).NetNameOffset,3);
    if (0x14 < *pvVar3) {
      local_468._M_current = local_20._M_current;
      local_470 = __gnu_cxx::
                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_20,4);
      local_478 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                            (&(this->CommonNetworkRelativeLink).NetNameOffsetUnicode);
      local_480 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  std::
                  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                            (local_468,local_470,
                             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              )local_478);
      local_490 = __gnu_cxx::
                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_20,4);
      local_488 = local_490._M_current;
      local_20 = local_490;
      local_498 = __gnu_cxx::
                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_20,4);
      local_4a0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                            (&(this->CommonNetworkRelativeLink).DeviceNameOffsetUnicode);
      local_4a8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  std::
                  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                            (local_490,local_498,
                             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              )local_4a0);
      local_4b0 = (uchar *)__gnu_cxx::
                           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           ::operator+(&local_20,4);
      local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )local_4b0;
    }
    local_4b8._M_current = local_20._M_current;
    local_4c0 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_4c8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&(this->CommonNetworkRelativeLink).NetName);
    local_4d0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (local_4b8,local_4c0,
                           (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )local_4c8);
    local_4e0 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_4d8 = local_4e0._M_current;
    local_20 = local_4e0;
    local_4e8 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,4);
    local_4f0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&(this->CommonNetworkRelativeLink).DeviceName);
    local_4f8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (local_4e0,local_4e8,
                           (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )local_4f0);
    local_500 = (uchar *)__gnu_cxx::
                         __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator+(&local_20,4);
    local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_500;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&(this->CommonNetworkRelativeLink).NetNameOffset,3);
    if (0x14 < *pvVar3) {
      local_508._M_current = local_20._M_current;
      local_510 = __gnu_cxx::
                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_20,4);
      local_518 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                            (&(this->CommonNetworkRelativeLink).NetNameUnicode);
      local_520 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  std::
                  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                            (local_508,local_510,
                             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              )local_518);
      local_530 = __gnu_cxx::
                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_20,4);
      local_528 = local_530._M_current;
      local_20 = local_530;
      local_538 = __gnu_cxx::
                  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_20,4);
      local_540 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                            (&(this->CommonNetworkRelativeLink).DeviceNameUnicode);
      local_548 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  std::
                  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                            (local_530,local_538,
                             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              )local_540);
      local_550 = (uchar *)__gnu_cxx::
                           __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           ::operator+(&local_20,4);
      local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )local_550;
    }
  }
  local_558._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->LinkInfoSize);
  local_560 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                (&this->LinkInfoSize);
  std::
  reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (local_558,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_560);
  local_568._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (&this->CommonPathSuffixOffset);
  iStack_570 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         (&this->CommonPathSuffixOffset);
  std::
  reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (local_568,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )iStack_570._M_current);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_590,&this->LinkInfoSize);
  uVar1 = Utils::lenFourBytes(&local_590);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_5a8,&this->CommonPathSuffixOffset);
  uVar2 = Utils::lenFourBytes(&local_5a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_5a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_590);
  local_5b0._M_current = local_20._M_current;
  local_574 = uVar1 - uVar2;
  local_5b8 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_20,(long)(int)(uVar1 - uVar2));
  local_5c0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        (&this->CommonPathSuffix);
  local_5c8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              std::
              copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                        (local_5b0,local_5b8,
                         (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )local_5c0);
  local_5d0 = (uchar *)__gnu_cxx::
                       __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ::operator+(&local_20,(long)local_574);
  local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_5d0;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->LinkInfoFlags,3);
  local_5e9 = 0;
  bVar4 = false;
  if (*pvVar3 == 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &countBytesBeforeNullTerminated_1,&this->LinkInfoHeaderSize);
    local_5e9 = 1;
    uVar1 = Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                &countBytesBeforeNullTerminated_1);
    bVar4 = 0x23 < uVar1;
  }
  if ((local_5e9 & 1) != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &countBytesBeforeNullTerminated_1);
  }
  if (bVar4) {
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_5f8,&local_20);
    local_5f0 = getCountOfBytesBeforeNullTerminatorForLBP(this,local_5f8);
    local_600._M_current = local_20._M_current;
    local_608 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_20,(long)local_5f0);
    local_610 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&this->LocalBasePathUnicode);
    local_618 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                std::
                copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (local_600,local_608,
                           (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            )local_610);
    local_620 = (uchar *)__gnu_cxx::
                         __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator+(&local_20,(long)local_5f0);
    local_20 = (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_620;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_638,
             &this->LinkInfoHeaderSize);
  uVar1 = Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_638);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_638);
  if (0x23 < uVar1) {
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_648,&local_20);
    local_63c = Utils::getCountOfBytesBeforeNullTerminator(local_648);
    __first._M_current = local_20._M_current;
    __last = __gnu_cxx::
             __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator+(&local_20,(long)local_63c);
    __result = std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                         (&this->CommonPathSuffixUnicode);
    std::
    copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (__first,__last,__result);
  }
  reverseAllFields(this);
  return;
}

Assistant:

void LinkInfo::fillLinkInfo(std::vector<unsigned char> linkInfo) {
    auto it = linkInfo.begin();
   /* mandatory fields */
    copy(it, it + 4, std::back_inserter(LinkInfoSize));                         // 4 byte
    it = it + 4;
    copy(it, it + 4, std::back_inserter(LinkInfoHeaderSize));                   // 4 byte
    it = it + 4;
    reverse(LinkInfoHeaderSize.begin(), LinkInfoHeaderSize.end());                              // Нужно для дальнейшей проверки

    copy(it, it + 4, std::back_inserter(LinkInfoFlags));                        // 4 byte
    it = it + 4;
    reverse(LinkInfoFlags.begin(), LinkInfoFlags.end());                                        // Нужно для дальнейшей проверки

    copy(it, it + 4, std::back_inserter(VolumeIDOffset));                       // 4 byte
    it = it + 4;
    copy(it, it + 4, std::back_inserter(LocalBasePathOffset));                  // 4 byte
    it = it + 4;
    copy(it, it+ 4, std::back_inserter(CommonNetworkRelativeLinkOffset));      // 4 byte
    it = it + 4;
    copy(it, it + 4, std::back_inserter(CommonPathSuffixOffset));               // 4 byte
    it = it + 4;

    /* optional fields */
    /* if the value of the LinkInfoHeaderSize field is greater than or equal to 0x00000024. */
    if (Utils::lenFourBytes(LinkInfoHeaderSize) >= 0x00000024) {
        /* if the VolumeIDAndLocalBasePath flag is set, this value is an offset, in bytes,
        from the start of the LinkInfo structure; otherwise, this value MUST be zero */
        copy(it, it + 4, std::back_inserter(LocalBasePathOffsetUnicode));       // 4 byte
        it = it + 4;
        copy(it, it + 4, std::back_inserter(CommonPathSuffixOffsetUnicode));    // 4 byte
        it = it + 4;
    }

    //  if the VolumeIDAndLocalBasePath flag is set.
    if (LinkInfoFlags[3] == VolumeIDAndLocalBasePath) {
        /* VolumeID structure */
        copy(it, it + 4, std::back_inserter(VolumeID.VolumeIDSize));                    // 4 byte
        it = it + 4;
        reverse(VolumeID.VolumeIDSize.begin(), VolumeID.VolumeIDSize.end());

        int count = Utils::lenFourBytes(VolumeID.VolumeIDSize);
        copy(it, it + 4, std::back_inserter(VolumeID.DriveType));                       // 4 byte
        it = it + 4;
        copy(it, it + 4, std::back_inserter(VolumeID.DriveSerialNumber));               // 4 byte
        it = it + 4;
        copy(it, it + 4, std::back_inserter(VolumeID.VolumeLabelOffset));               // 4 byte
        it = it + 4;
        reverse(VolumeID.VolumeLabelOffset.begin(), VolumeID.VolumeLabelOffset.end());     // Нужно для дальнейшей проверки

        /* optional fields */
        if (VolumeID.VolumeLabelOffset[3] != 0x00000010) {   // По документации 14
            copy(it, it + 4, std::back_inserter(VolumeID.VolumeLabelOffsetUnicode));    // 4 byte
            it = it + 4;
            count = count - 4;
        }

        copy(it, it + count - 16, std::back_inserter(VolumeID.Data));                   // 4 byte
        it = it + count - 16;
        /* end of VolumeID structure*/

        /* LocalBasePathOffset specifies the location of the LocalBasePath field */
        //NULL–terminated string
        int countBytesBeforeNullTerminated  = Utils::getCountOfBytesBeforeNullTerminator(it);
        copy(it, it + countBytesBeforeNullTerminated - 1, std::back_inserter(LocalBasePath));
        it = it + countBytesBeforeNullTerminated - 1;
    }

    /* if LinkInfoFlags  = CommonNetworkRelativeLinkAndPathSuffix (gj CommonNetworkRelativeLinkOffset ) */
    if (LinkInfoFlags[3] == CommonNetworkRelativeLinkAndPathSuffix) {
        /* fill CommonNetworkRelativeLink structure */
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.CommonNetworkRelativeLinkSize));                    // 4 byte
        it = it + 4;
        reverse(CommonNetworkRelativeLink.CommonNetworkRelativeLinkSize.begin(),
                CommonNetworkRelativeLink.CommonNetworkRelativeLinkSize.end());
        int count = Utils::lenFourBytes(CommonNetworkRelativeLink.CommonNetworkRelativeLinkSize);
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.CommonNetworkRelativeLinkFlags));                   // 4 byte
        it = it + 4;
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.NetNameOffset));                                    // 4 byte
        it = it + 4;
        reverse(CommonNetworkRelativeLink.NetNameOffset.begin(),
                CommonNetworkRelativeLink.NetNameOffset.end());

        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.DeviceNameOffset));                                 // 4 byte
        it = it + 4;
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.NetworkProviderType));                              // 4 byte
        it = it + 4;
        /* optional fields */
        /* if the value of the NetNameOffset field is greater than 0x00000014 */
        if (CommonNetworkRelativeLink.NetNameOffset[3] > 0x00000014) {
            copy(it, it + 4, std::back_inserter(
                    CommonNetworkRelativeLink.NetNameOffsetUnicode));                         // 4 byte
            it = it + 4;
            copy(it, it + 4, std::back_inserter(
                    CommonNetworkRelativeLink.DeviceNameOffsetUnicode));                      // 4 byte
            it = it + 4;
        }
        /* end optional fields */
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.NetName));
        it = it + 4;
        copy(it, it + 4, std::back_inserter(
                CommonNetworkRelativeLink.DeviceName));
        it = it + 4;
        /* optional fields */
        /* NetNameOffset field is greater than 0x00000014 */
        if (CommonNetworkRelativeLink.NetNameOffset[3] > 0x00000014) {
            copy(it, it + 4, std::back_inserter(
                    CommonNetworkRelativeLink.NetNameUnicode));
            it = it + 4;
            copy(it, it + 4, std::back_inserter(
                    CommonNetworkRelativeLink.DeviceNameUnicode));
            it = it + 4;
        }
        /* end CommonNetworkRelativeLink structure */
    }

    reverse(LinkInfoSize.begin(), LinkInfoSize.end());
    reverse(CommonPathSuffixOffset.begin(), CommonPathSuffixOffset.end());
    int len = Utils::lenFourBytes(LinkInfoSize) - Utils::lenFourBytes(CommonPathSuffixOffset);
    copy(it, it + len, std::back_inserter(CommonPathSuffix));
    it = it + len;

    /* optional fields */
    /* VolumeIDAndLocalBasePath flag is set and the value of the LinkInfoHeaderSize
       field is greater than or equal to 0x00000024. */
    if (LinkInfoFlags[3] == VolumeIDAndLocalBasePath && Utils::lenFourBytes(LinkInfoHeaderSize) >= 0x00000024) {
        int countBytesBeforeNullTerminated  = LinkInfo::getCountOfBytesBeforeNullTerminatorForLBP(it);
        copy(it, it + countBytesBeforeNullTerminated, std::back_inserter(LocalBasePathUnicode));
        it = it + countBytesBeforeNullTerminated;
    }

    /* if the value of the LinkInfoHeaderSize field is greater than or equal to 0x00000024. */
    if (Utils::lenFourBytes(LinkInfoHeaderSize) >= 0x00000024) {
        int countBytesBeforeNullTerminated  = Utils::getCountOfBytesBeforeNullTerminator(it);
        copy(it, it + countBytesBeforeNullTerminated, std::back_inserter(CommonPathSuffixUnicode));
    }
    LinkInfo::reverseAllFields();
}